

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

GLFWbool createXdgShellObjects(_GLFWwindow *window)

{
  xdg_surface *pxVar1;
  xdg_toplevel *pxVar2;
  zxdg_toplevel_decoration_v1 *pzVar3;
  _GLFWwindow *in_RDI;
  uint32_t mode;
  xdg_surface *unaff_retaddr;
  _GLFWwindow *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe8;
  GLFWbool in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  uint32_t in_stack_fffffffffffffffc;
  GLFWbool GVar4;
  
  pxVar1 = xdg_wm_base_get_xdg_surface((xdg_wm_base *)in_stack_00000010,(wl_surface *)window);
  (in_RDI->wl).xdg.surface = pxVar1;
  if ((in_RDI->wl).xdg.surface == (xdg_surface *)0x0) {
    _glfwInputError(0x10008,"Wayland: Failed to create xdg-surface for window");
    GVar4 = 0;
  }
  else {
    xdg_surface_add_listener
              ((xdg_surface *)in_RDI,
               (xdg_surface_listener *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
               ,(void *)0xc1f713);
    pxVar2 = xdg_surface_get_toplevel(unaff_retaddr);
    (in_RDI->wl).xdg.toplevel = pxVar2;
    if ((in_RDI->wl).xdg.toplevel == (xdg_toplevel *)0x0) {
      _glfwInputError(0x10008,"Wayland: Failed to create xdg-toplevel for window");
      GVar4 = 0;
    }
    else {
      xdg_toplevel_add_listener
                ((xdg_toplevel *)in_RDI,
                 (xdg_toplevel_listener *)
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(void *)0xc1f77f);
      if ((in_RDI->wl).appId != (char *)0x0) {
        xdg_toplevel_set_app_id
                  ((xdg_toplevel *)unaff_retaddr,
                   (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
      xdg_toplevel_set_title
                ((xdg_toplevel *)unaff_retaddr,
                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (in_RDI->monitor == (_GLFWmonitor *)0x0) {
        if ((in_RDI->wl).maximized != 0) {
          xdg_toplevel_set_maximized((xdg_toplevel *)in_RDI);
        }
        setIdleInhibitor(in_RDI,in_stack_ffffffffffffffec);
      }
      else {
        xdg_toplevel_set_fullscreen
                  ((xdg_toplevel *)unaff_retaddr,
                   (wl_output *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        setIdleInhibitor(in_RDI,in_stack_ffffffffffffffec);
      }
      if (_glfw.wl.decorationManager == (zxdg_decoration_manager_v1 *)0x0) {
        if ((in_RDI->decorated != 0) && (in_RDI->monitor == (_GLFWmonitor *)0x0)) {
          createFallbackDecorations(in_stack_00000010);
        }
      }
      else {
        pzVar3 = zxdg_decoration_manager_v1_get_toplevel_decoration
                           ((zxdg_decoration_manager_v1 *)in_stack_00000010,(xdg_toplevel *)window);
        (in_RDI->wl).xdg.decoration = pzVar3;
        zxdg_toplevel_decoration_v1_add_listener
                  ((zxdg_toplevel_decoration_v1 *)in_RDI,
                   (zxdg_toplevel_decoration_v1_listener *)
                   CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(void *)0xc1f88a);
        zxdg_toplevel_decoration_v1_set_mode
                  ((zxdg_toplevel_decoration_v1 *)unaff_retaddr,in_stack_fffffffffffffffc);
      }
      updateXdgSizeLimits(in_RDI);
      wl_surface_commit((wl_surface *)in_RDI);
      (*_glfw.wl.client.display_roundtrip)(_glfw.wl.display);
      GVar4 = 1;
    }
  }
  return GVar4;
}

Assistant:

static GLFWbool createXdgShellObjects(_GLFWwindow* window)
{
    window->wl.xdg.surface = xdg_wm_base_get_xdg_surface(_glfw.wl.wmBase,
                                                         window->wl.surface);
    if (!window->wl.xdg.surface)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create xdg-surface for window");
        return GLFW_FALSE;
    }

    xdg_surface_add_listener(window->wl.xdg.surface, &xdgSurfaceListener, window);

    window->wl.xdg.toplevel = xdg_surface_get_toplevel(window->wl.xdg.surface);
    if (!window->wl.xdg.toplevel)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create xdg-toplevel for window");
        return GLFW_FALSE;
    }

    xdg_toplevel_add_listener(window->wl.xdg.toplevel, &xdgToplevelListener, window);

    if (window->wl.appId)
        xdg_toplevel_set_app_id(window->wl.xdg.toplevel, window->wl.appId);

    xdg_toplevel_set_title(window->wl.xdg.toplevel, window->title);

    if (window->monitor)
    {
        xdg_toplevel_set_fullscreen(window->wl.xdg.toplevel, window->monitor->wl.output);
        setIdleInhibitor(window, GLFW_TRUE);
    }
    else
    {
        if (window->wl.maximized)
            xdg_toplevel_set_maximized(window->wl.xdg.toplevel);

        setIdleInhibitor(window, GLFW_FALSE);
    }

    if (_glfw.wl.decorationManager)
    {
        window->wl.xdg.decoration =
            zxdg_decoration_manager_v1_get_toplevel_decoration(
                _glfw.wl.decorationManager, window->wl.xdg.toplevel);
        zxdg_toplevel_decoration_v1_add_listener(window->wl.xdg.decoration,
                                                 &xdgDecorationListener,
                                                 window);

        uint32_t mode;

        if (window->decorated)
            mode = ZXDG_TOPLEVEL_DECORATION_V1_MODE_SERVER_SIDE;
        else
            mode = ZXDG_TOPLEVEL_DECORATION_V1_MODE_CLIENT_SIDE;

        zxdg_toplevel_decoration_v1_set_mode(window->wl.xdg.decoration, mode);
    }
    else
    {
        if (window->decorated && !window->monitor)
            createFallbackDecorations(window);
    }

    updateXdgSizeLimits(window);

    wl_surface_commit(window->wl.surface);
    wl_display_roundtrip(_glfw.wl.display);
    return GLFW_TRUE;
}